

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseModule
          (WastParser *this,unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *out_module
          )

{
  vector<wabt::Error,std::allocator<wabt::Error>> *this_00;
  __single_object __p;
  bool bVar1;
  Result RVar2;
  TokenType TVar3;
  TokenTypePair pair;
  Enum EVar4;
  long lVar5;
  allocator<char> local_92;
  allocator<char> local_91;
  __single_object module;
  long *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  Location local_70;
  string local_50 [32];
  
  std::make_unique<wabt::Module>();
  bVar1 = PeekMatchLpar(this,Module);
  EVar4 = Error;
  if (bVar1) {
    local_70.filename._M_len = 0;
    RVar2 = ParseModuleCommand(this,(Script *)0x0,(CommandPtr *)&local_70);
    if (RVar2.enum_ != Error) {
      if ((int)*(long *)(local_70.filename._M_len + 8) == 1) {
        cast<wabt::ScriptModuleCommand,wabt::Command>
                  ((wabt *)&local_88,
                   (unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_> *)&local_70);
      }
      else {
        if ((int)*(long *)(local_70.filename._M_len + 8) != 0) {
          __assert_fail("isa<ScriptModuleCommand>(command.get())",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                        ,0x4a2,"Result wabt::WastParser::ParseModule(std::unique_ptr<Module> *)");
        }
        cast<wabt::ModuleCommand,wabt::Command>
                  ((wabt *)&local_88,
                   (unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_> *)&local_70);
      }
      Module::operator=((Module *)
                        module._M_t.
                        super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t
                        .super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
                        super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl,
                        (Module *)(local_88 + 2));
      if (local_88 != (long *)0x0) {
        (**(code **)(*local_88 + 8))();
      }
    }
    if ((long *)local_70.filename._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_70.filename._M_len + 8))();
    }
joined_r0x00135161:
    if (RVar2.enum_ == Error) goto LAB_001352c4;
  }
  else {
    pair = PeekPair(this);
    bVar1 = anon_unknown_1::IsModuleField(pair);
    if ((bVar1) || (bVar1 = PeekIsCustom(this), bVar1)) {
      RVar2 = ParseModuleFieldList
                        (this,(Module *)
                              module._M_t.
                              super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>
                              .super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl);
      goto joined_r0x00135161;
    }
    TVar3 = Peek(this,0);
    if (TVar3 == Eof) {
      this_00 = (vector<wabt::Error,std::allocator<wabt::Error>> *)this->errors_;
      local_88 = (long *)((ulong)local_88 & 0xffffffff00000000);
      GetLocation(&local_70,this);
      std::vector<wabt::Error,std::allocator<wabt::Error>>::
      emplace_back<wabt::ErrorLevel,wabt::Location,char_const(&)[13]>
                (this_00,(ErrorLevel *)&local_88,&local_70,(char (*) [13])"empty module");
    }
    else {
      ConsumeIfLpar(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"a module field",&local_91);
      std::__cxx11::string::string<std::allocator<char>>(local_50,"a module",&local_92);
      local_88 = (long *)0x0;
      uStack_80 = 0;
      local_78 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                 &local_70,&stack0xffffffffffffffd0);
      ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_88,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_88);
      lVar5 = 0x20;
      do {
        std::__cxx11::string::_M_dispose();
        lVar5 = lVar5 + -0x20;
      } while (lVar5 != -0x20);
    }
  }
  RVar2 = Expect(this,Eof);
  if ((RVar2.enum_ != Error) && (bVar1 = HasError(this), __p = module, !bVar1)) {
    module._M_t.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
    super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl =
         (__uniq_ptr_data<wabt::Module,_std::default_delete<wabt::Module>,_true,_true>)
         (__uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>)0x0;
    std::__uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>::reset
              ((__uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_> *)out_module,
               (pointer)__p._M_t.
                        super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t
                        .super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
                        super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl);
    EVar4 = Ok;
  }
LAB_001352c4:
  std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::~unique_ptr(&module);
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseModule(std::unique_ptr<Module>* out_module) {
  WABT_TRACE(ParseModule);
  auto module = std::make_unique<Module>();

  if (PeekMatchLpar(TokenType::Module)) {
    // Starts with "(module". Allow text and binary modules, but no quoted
    // modules.
    CommandPtr command;
    CHECK_RESULT(ParseModuleCommand(nullptr, &command));
    if (isa<ModuleCommand>(command.get())) {
      auto module_command = cast<ModuleCommand>(std::move(command));
      *module = std::move(module_command->module);
    } else {
      assert(isa<ScriptModuleCommand>(command.get()));
      auto module_command = cast<ScriptModuleCommand>(std::move(command));
      *module = std::move(module_command->module);
    }
  } else if (IsModuleField(PeekPair()) || PeekIsCustom()) {
    // Parse an inline module (i.e. one with no surrounding (module)).
    CHECK_RESULT(ParseModuleFieldList(module.get()));
  } else if (PeekMatch(TokenType::Eof)) {
    errors_->emplace_back(ErrorLevel::Warning, GetLocation(), "empty module");
  } else {
    ConsumeIfLpar();
    ErrorExpected({"a module field", "a module"});
  }

  EXPECT(Eof);
  if (!HasError()) {
    *out_module = std::move(module);
    return Result::Ok;
  } else {
    return Result::Error;
  }
}